

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QRectF * __thiscall
QGraphicsItemPrivate::sceneEffectiveBoundingRect
          (QRectF *__return_storage_ptr__,QGraphicsItemPrivate *this)

{
  QGraphicsItemPrivate *pQVar1;
  long lVar2;
  QTransform *pQVar3;
  QGraphicsItem **ppQVar4;
  QGraphicsItem *pQVar5;
  long in_FS_OFFSET;
  byte bVar6;
  QGraphicsItem *that;
  double local_a8;
  double dStack_a0;
  undefined1 local_98 [12];
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  QGraphicsItem *local_70 [10];
  long local_20;
  
  bVar6 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = this->q_ptr;
  local_a8 = 0.0;
  dStack_a0 = 0.0;
  do {
    pQVar1 = (pQVar5->d_ptr).d;
    if (pQVar1->transformData != (TransformData *)0x0) goto LAB_005e9e59;
    local_a8 = local_a8 + (pQVar1->pos).xp;
    dStack_a0 = dStack_a0 + (pQVar1->pos).yp;
    pQVar5 = pQVar1->parent;
  } while (pQVar5 != (QGraphicsItem *)0x0);
  pQVar5 = (QGraphicsItem *)0x0;
LAB_005e9e59:
  local_88 = 0xffffffff;
  uStack_84 = 0xffffffff;
  uStack_80 = 0xffffffff;
  uStack_7c = 0xffffffff;
  local_98._8_4_ = 0xffffffff;
  local_98._0_8_ = 0xffffffffffffffff;
  uStack_8c = 0xffffffff;
  effectiveBoundingRect((QRectF *)local_98,this,(QGraphicsItem *)0x0);
  local_a8 = local_a8 + (double)local_98._0_8_;
  dStack_a0 = dStack_a0 + stack0xffffffffffffff70;
  local_98._8_4_ = SUB84(dStack_a0,0);
  local_98._0_8_ = local_a8;
  uStack_8c = (int)((ulong)dStack_a0 >> 0x20);
  if (pQVar5 == (QGraphicsItem *)0x0) {
    __return_storage_ptr__->w = (qreal)CONCAT44(uStack_84,local_88);
    __return_storage_ptr__->h = (qreal)CONCAT44(uStack_7c,uStack_80);
    __return_storage_ptr__->xp = local_a8;
    __return_storage_ptr__->yp = dStack_a0;
  }
  else {
    pQVar1 = (pQVar5->d_ptr).d;
    local_70[0] = pQVar1->q_ptr;
    ensureSceneTransformRecursive(pQVar1,local_70);
    pQVar3 = &((pQVar5->d_ptr).d)->sceneTransform;
    ppQVar4 = local_70;
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *ppQVar4 = (QGraphicsItem *)pQVar3->m_matrix[0][0];
      pQVar3 = (QTransform *)((long)pQVar3 + (ulong)bVar6 * -0x10 + 8);
      ppQVar4 = ppQVar4 + (ulong)bVar6 * -2 + 1;
    }
    QTransform::mapRect(__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QGraphicsItemPrivate::sceneEffectiveBoundingRect() const
{
    // Find translate-only offset
    // COMBINE
    QPointF offset;
    const QGraphicsItem *parentItem = q_ptr;
    const QGraphicsItemPrivate *itemd;
    do {
        itemd = parentItem->d_ptr.data();
        if (itemd->transformData)
            break;
        offset += itemd->pos;
    } while ((parentItem = itemd->parent));

    QRectF br = effectiveBoundingRect();
    br.translate(offset);
    return !parentItem ? br : parentItem->sceneTransform().mapRect(br);
}